

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

work_t __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::maxValue
          (Image<float,_gimage::PixelTraits<float>_> *this)

{
  float fVar1;
  long lVar2;
  long i;
  long lVar3;
  work_t wVar4;
  work_t wVar5;
  
  lVar3 = this->n;
  lVar2 = -lVar3;
  if (0 < lVar3) {
    lVar2 = lVar3;
  }
  wVar4 = -3.4028235e+38;
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    fVar1 = this->pixel[lVar3];
    wVar5 = wVar4;
    if (((uint)ABS(fVar1) < 0x7f800000) && (wVar5 = fVar1, fVar1 <= wVar4)) {
      wVar5 = wVar4;
    }
    wVar4 = wVar5;
  }
  return wVar4;
}

Assistant:

work_t maxValue() const
    {
      work_t ret=ptraits::minValue();

      long pn=std::abs(n);
      for (long i=0; i<pn; i++)
      {
        if (isValidS(pixel[i]))
        {
          ret=std::max(ret, static_cast<work_t>(pixel[i]));
        }
      }

      return ret;
    }